

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O1

void __thiscall r_code::SysView::SysView(SysView *this,View *source)

{
  iterator __position;
  Atom *this_00;
  View *a;
  size_t i;
  size_t i_00;
  long lVar1;
  uint local_2c;
  
  (this->super_ImageObject).references.m_vector.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_ImageObject).references.m_vector.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_ImageObject).code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_ImageObject).references.m_vector.
  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_ImageObject).code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_ImageObject).code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_ImageObject)._vptr_ImageObject = (_func_int **)&PTR__ImageObject_0010cc40;
  a = source + 0x28;
  i_00 = 0;
  do {
    this_00 = vector<r_code::Atom>::operator[](&(this->super_ImageObject).code,i_00);
    Atom::operator=(this_00,(Atom *)a);
    i_00 = i_00 + 1;
    a = a + 4;
  } while (i_00 != 0xd);
  lVar1 = 0;
  do {
    if (*(long *)(source + lVar1 * 8 + 0x10) != 0) {
      local_2c = 0;
      __position._M_current =
           (this->super_ImageObject).references.m_vector.
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_ImageObject).references.m_vector.
          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)
                   &(this->super_ImageObject).references,__position,&local_2c);
      }
      else {
        *__position._M_current = 0;
        (this->super_ImageObject).references.m_vector.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 == 1);
  return;
}

Assistant:

SysView::SysView(View *source)
{
    for (size_t i = 0; i < VIEW_CODE_MAX_SIZE; ++i) {
        code[i] = source->code(i);
    }

    for (size_t i = 0; i < 2; ++i) // to get the right size in Image::add_object().
        if (source->references[i]) {
            references.push_back(0);
        }
}